

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O3

void __thiscall
Js::CompoundString::CopyVirtual
          (CompoundString *this,char16 *buffer,StringCopyInfoStack *nestedStringTreeCopyInfos,
          byte recursionDepth)

{
  code *pcVar1;
  StringCopyInfo copyInfo;
  bool bVar2;
  charcount_t cVar3;
  CharCount CVar4;
  int iVar5;
  uint uVar6;
  char16 *pcVar7;
  undefined4 *puVar8;
  JavascriptString *pJVar9;
  undefined7 in_register_00000009;
  uint uVar10;
  Block *pBVar11;
  size_t sizeInWords;
  Type TVar12;
  Block *pBVar13;
  ulong uVar14;
  Block *pBVar15;
  StringCopyInfo local_a8;
  char16 *local_90;
  ulong local_88;
  undefined8 local_80;
  StringCopyInfoStack *local_78;
  CompoundString *local_70;
  int local_68;
  Type local_64;
  Block *local_60;
  uint local_54;
  Block *local_50;
  char16 *local_48;
  JavascriptString *local_40;
  ulong local_38;
  
  local_80 = CONCAT71(in_register_00000009,recursionDepth);
  local_78 = nestedStringTreeCopyInfos;
  local_48 = buffer;
  pcVar7 = JavascriptString::UnsafeGetBuffer((JavascriptString *)this);
  if (pcVar7 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x41e,"(!IsFinalized())","!IsFinalized()");
    if (!bVar2) goto LAB_00b2b658;
    *puVar8 = 0;
  }
  if (local_48 == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x41f,"(buffer)","buffer");
    if (!bVar2) goto LAB_00b2b658;
    *puVar8 = 0;
  }
  cVar3 = JavascriptString::GetLength((JavascriptString *)this);
  if (cVar3 == 0) {
    return;
  }
  if (cVar3 == 1) {
    if (this->directCharLength != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x428,"(HasOnlyDirectChars())","HasOnlyDirectChars()");
      if (!bVar2) goto LAB_00b2b658;
      *puVar8 = 0;
    }
    if ((this->lastBlockInfo).charLength != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x429,"(LastBlockCharLength() == 1)","LastBlockCharLength() == 1"
                                 );
      if (!bVar2) goto LAB_00b2b658;
      *puVar8 = 0;
    }
    *local_48 = *(this->lastBlockInfo).buffer.ptr;
    return;
  }
  local_64 = this->directCharLength;
  TVar12 = local_64;
  if (local_64 == 0xffffffff) {
    TVar12 = cVar3;
  }
  local_60 = (this->lastBlock).ptr;
  pBVar11 = (Block *)(this->lastBlockInfo).buffer.ptr;
  local_70 = this;
  CVar4 = Block::PointerLengthFromCharLength((this->lastBlockInfo).charLength);
  local_54 = TVar12;
  local_38 = (ulong)cVar3;
  if (TVar12 < cVar3) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_68 = (int)local_80 + 1;
    pBVar13 = local_60;
    do {
      if (CVar4 == 0) {
        do {
          if (pBVar13 == (Block *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x43b,"(block)","block");
            if (!bVar2) goto LAB_00b2b658;
            *puVar8 = 0;
          }
          pBVar13 = (pBVar13->previous).ptr;
          if (pBVar13 == (Block *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                        ,0x43d,"(block)","block");
            if (!bVar2) goto LAB_00b2b658;
            *puVar8 = 0;
          }
          pBVar11 = (pBVar13->bufferOwner).ptr;
          CVar4 = Block::PointerLengthFromCharLength(pBVar13->charLength);
        } while (CVar4 == 0);
        pBVar11 = pBVar11 + 1;
      }
      pJVar9 = (JavascriptString *)(ulong)(CVar4 - 1);
      local_50 = (&pBVar11->bufferOwner)[(long)pJVar9].ptr;
      if (local_50 == (Block *)0x0) {
        AssertCount = AssertCount + 1;
        local_40 = pJVar9;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x2f2,"(pointer)","pointer");
        if (!bVar2) goto LAB_00b2b658;
        *puVar8 = 0;
        pJVar9 = local_40;
      }
      if (((ulong)local_50 & 1) == 0) {
        local_40 = pJVar9;
        pJVar9 = VarTo<Js::JavascriptString>(local_50);
        cVar3 = JavascriptString::GetLength(pJVar9);
        uVar14 = (ulong)((uint)local_38 - cVar3);
        if ((uint)local_38 < cVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x465,"(remainingCharLengthToCopy >= copyCharLength)",
                                      "remainingCharLengthToCopy >= copyCharLength");
          if (!bVar2) goto LAB_00b2b658;
          *puVar8 = 0;
        }
        if ((byte)local_80 == 3) {
          iVar5 = (*(pJVar9->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6a])(pJVar9);
          if ((char)iVar5 != '\0') {
            StringCopyInfo::StringCopyInfo(&local_a8,pJVar9,local_48 + uVar14);
            copyInfo.destinationBuffer = local_a8.destinationBuffer;
            copyInfo.sourceString = local_a8.sourceString;
            copyInfo.isInitialized = local_a8.isInitialized;
            copyInfo._17_7_ = local_a8._17_7_;
            StringCopyInfoStack::Push(local_78,copyInfo);
            pJVar9 = local_40;
            goto LAB_00b2b216;
          }
        }
        else if (3 < (byte)local_80) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x470,"(recursionDepth <= MaxCopyRecursionDepth)",
                                      "recursionDepth <= MaxCopyRecursionDepth");
          if (!bVar2) goto LAB_00b2b658;
          *puVar8 = 0;
        }
        JavascriptString::Copy(pJVar9,local_48 + uVar14,local_78,(byte)local_68);
        pJVar9 = local_40;
      }
      else {
        if ((int)pJVar9 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x445,"(pointerIndex != 0)","pointerIndex != 0");
          if (!bVar2) goto LAB_00b2b658;
          *puVar8 = 0;
        }
        pBVar15 = (&pBVar11->bufferOwner)[(long)(ulong)(CVar4 - 2)].ptr;
        if (pBVar15 == (Block *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x2f2,"(pointer)","pointer");
          if (!bVar2) goto LAB_00b2b658;
          *puVar8 = 0;
        }
        if (((ulong)pBVar15 & 1) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x449,"(!IsPackedInfo(pointer2))","!IsPackedInfo(pointer2)");
          if (!bVar2) goto LAB_00b2b658;
          *puVar8 = 0;
        }
        pJVar9 = VarTo<Js::JavascriptString>(pBVar15);
        if (local_50 == (Block *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x2fd,"(pointer)","pointer");
          if (!bVar2) goto LAB_00b2b658;
          *puVar8 = 0;
        }
        pBVar15 = local_50;
        uVar14 = (ulong)local_50 >> 0x20;
        local_40 = pJVar9;
        cVar3 = JavascriptString::GetLength(pJVar9);
        local_88 = uVar14;
        if (cVar3 < (uint)((ulong)pBVar15 >> 0x20)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x459,"(startIndex <= s->GetLength())",
                                      "startIndex <= s->GetLength()");
          if (!bVar2) goto LAB_00b2b658;
          *puVar8 = 0;
        }
        pBVar15 = (Block *)((ulong)local_50 >> 1 & 0x7fffffff);
        cVar3 = JavascriptString::GetLength(local_40);
        uVar10 = (uint)pBVar15;
        if (cVar3 - (int)local_88 < uVar10) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x45a,"(copyCharLength <= s->GetLength() - startIndex)",
                                      "copyCharLength <= s->GetLength() - startIndex");
          if (!bVar2) goto LAB_00b2b658;
          *puVar8 = 0;
        }
        uVar6 = (uint)local_38;
        local_38 = (ulong)(uVar6 - uVar10);
        local_50 = pBVar15;
        if (uVar6 < uVar10) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                      ,0x45c,"(remainingCharLengthToCopy >= copyCharLength)",
                                      "remainingCharLengthToCopy >= copyCharLength");
          if (!bVar2) goto LAB_00b2b658;
          *puVar8 = 0;
        }
        uVar14 = local_38;
        local_90 = local_48 + local_38;
        pcVar7 = JavascriptString::GetString(local_40);
        JavascriptString::CopyHelper(local_90,pcVar7 + local_88,(charcount_t)local_50);
        pJVar9 = (JavascriptString *)(ulong)(CVar4 - 2);
      }
LAB_00b2b216:
      CVar4 = (CharCount)pJVar9;
      local_38 = uVar14;
    } while (local_54 < (uint)uVar14);
  }
  else {
    pJVar9 = (JavascriptString *)(ulong)CVar4;
    pBVar13 = local_60;
  }
  uVar14 = local_38;
  uVar10 = (uint)local_38;
  if (uVar10 != local_54) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x476,"(remainingCharLengthToCopy == directCharLength)",
                                "remainingCharLengthToCopy == directCharLength");
    if (!bVar2) goto LAB_00b2b658;
    *puVar8 = 0;
  }
  if (uVar10 == 0) {
LAB_00b2b5c3:
    if (pBVar13 == (Block *)0x0) {
      return;
    }
    pBVar11 = (pBVar13->previous).ptr;
    if (pBVar11 == (Block *)0x0) {
      return;
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (pBVar11->charLength != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x4ba,"(block->CharLength() == 0)","block->CharLength() == 0");
        if (!bVar2) goto LAB_00b2b658;
        *puVar8 = 0;
      }
      pBVar11 = (pBVar11->previous).ptr;
      if (pBVar11 == (Block *)0x0) {
        return;
      }
    } while( true );
  }
  if ((int)pJVar9 == 0) {
    if (pBVar13 == (Block *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x47f,"(block)","block");
      if (!bVar2) goto LAB_00b2b658;
      *puVar8 = 0;
    }
    pBVar13 = (pBVar13->previous).ptr;
    if (pBVar13 == (Block *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x481,"(block)","block");
      if (!bVar2) {
LAB_00b2b658:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
  }
  else {
    if (local_64 != 0xffffffff) {
      sizeInWords = uVar14 & 0xffffffff;
      local_40 = pJVar9;
      if (pBVar13 != (Block *)0x0) {
        pBVar11 = (pBVar13->previous).ptr;
        sizeInWords = local_38 & 0xffffffff;
        if (pBVar11 != (Block *)0x0) {
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          sizeInWords = local_38 & 0xffffffff;
          do {
            uVar10 = pBVar11->charLength;
            if ((uint)sizeInWords < uVar10) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar8 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                          ,0x494,"(blockCharLength >= previousBlock->CharLength())",
                                          "blockCharLength >= previousBlock->CharLength()");
              if (!bVar2) goto LAB_00b2b658;
              *puVar8 = 0;
              uVar10 = pBVar11->charLength;
            }
            sizeInWords = (size_t)((uint)sizeInWords - uVar10);
            pBVar11 = (pBVar11->previous).ptr;
          } while (pBVar11 != (Block *)0x0);
        }
      }
      CVar4 = Block::PointerLengthFromCharLength((CharCount)sizeInWords);
      if (CVar4 != (CharCount)local_40) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x498,
                                    "(Block::PointerLengthFromCharLength(blockCharLength) == pointerIndex)"
                                    ,
                                    "Block::PointerLengthFromCharLength(blockCharLength) == pointerIndex"
                                   );
        if (!bVar2) goto LAB_00b2b658;
        *puVar8 = 0;
      }
      goto LAB_00b2b47e;
    }
    if (pBVar13 == local_60) {
      sizeInWords = (size_t)(local_70->lastBlockInfo).charLength;
      goto LAB_00b2b47e;
    }
  }
  sizeInWords = (size_t)pBVar13->charLength;
LAB_00b2b47e:
  if (pBVar13 == local_60) {
    pBVar11 = (Block *)(local_70->lastBlockInfo).buffer.ptr;
  }
  else {
    pBVar11 = (pBVar13->bufferOwner).ptr + 1;
  }
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    uVar10 = (uint)sizeInWords;
    if (uVar10 != 0) {
      uVar6 = (uint)local_38;
      local_38 = (ulong)(uVar6 - uVar10);
      if (uVar6 < uVar10) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                    ,0x4a1,"(remainingCharLengthToCopy >= blockCharLength)",
                                    "remainingCharLengthToCopy >= blockCharLength");
        if (!bVar2) goto LAB_00b2b658;
        *puVar8 = 0;
      }
      uVar14 = local_38;
      js_wmemcpy_s(local_48 + local_38,sizeInWords,(char16 *)pBVar11,sizeInWords);
      if ((int)uVar14 == 0) goto LAB_00b2b5c3;
    }
    if (pBVar13 == (Block *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x4a9,"(block)","block");
      if (!bVar2) goto LAB_00b2b658;
      *puVar8 = 0;
    }
    pBVar13 = (pBVar13->previous).ptr;
    if (pBVar13 == (Block *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                  ,0x4ab,"(block)","block");
      if (!bVar2) goto LAB_00b2b658;
      *puVar8 = 0;
    }
    pBVar11 = (pBVar13->bufferOwner).ptr + 1;
    sizeInWords = (size_t)pBVar13->charLength;
  } while( true );
}

Assistant:

void CompoundString::CopyVirtual(
        _Out_writes_(m_charLength) char16 *const buffer,
        StringCopyInfoStack &nestedStringTreeCopyInfos,
        const byte recursionDepth)
    {
        Assert(!IsFinalized());
        Assert(buffer);

        const CharCount totalCharLength = GetLength();
        switch(totalCharLength)
        {
            case 0:
                return;

            case 1:
                Assert(HasOnlyDirectChars());
                Assert(LastBlockCharLength() == 1);

                buffer[0] = LastBlockChars()[0];
                return;
        }

        // Copy buffers from string pointers
        const bool hasOnlyDirectChars = HasOnlyDirectChars();
        const CharCount directCharLength = hasOnlyDirectChars ? totalCharLength : this->directCharLength;
        CharCount remainingCharLengthToCopy = totalCharLength;
        const Block *const lastBlock = this->lastBlock;
        const Block *block = lastBlock;
        Field(void*) const *blockPointers = LastBlockPointers();
        CharCount pointerIndex = LastBlockPointerLength();
        while(remainingCharLengthToCopy > directCharLength)
        {
            while(pointerIndex == 0)
            {
                Assert(block);
                block = block->Previous();
                Assert(block);
                blockPointers = (Field(void*) const *)block->Pointers();
                pointerIndex = block->PointerLength();
            }

            void *const pointer = blockPointers[--pointerIndex];
            if(IsPackedInfo(pointer))
            {
                Assert(pointerIndex != 0);
                void *pointer2 = blockPointers[--pointerIndex];
                JavascriptString *s;
    #if defined(TARGET_64)
                Assert(!IsPackedInfo(pointer2));
    #else
                if(IsPackedInfo(pointer2))
                {
                    Assert(pointerIndex != 0);
                    s = VarTo<JavascriptString>(blockPointers[--pointerIndex]);
                }
                else
    #endif
                {
                    s = VarTo<JavascriptString>(pointer2);
                    pointer2 = nullptr;
                }

                CharCount startIndex, copyCharLength;
                UnpackSubstringInfo(pointer, pointer2, &startIndex, &copyCharLength);
                Assert(startIndex <= s->GetLength());
                Assert(copyCharLength <= s->GetLength() - startIndex);

                Assert(remainingCharLengthToCopy >= copyCharLength);
                remainingCharLengthToCopy -= copyCharLength;
                CopyHelper(&buffer[remainingCharLengthToCopy], &s->GetString()[startIndex], copyCharLength);
            }
            else
            {
                JavascriptString *const s = VarTo<JavascriptString>(pointer);
                const CharCount copyCharLength = s->GetLength();

                Assert(remainingCharLengthToCopy >= copyCharLength);
                remainingCharLengthToCopy -= copyCharLength;
                if(recursionDepth == MaxCopyRecursionDepth && s->IsTree())
                {
                    // Don't copy nested string trees yet, as that involves a recursive call, and the recursion can become
                    // excessive. Just collect the nested string trees and the buffer location where they should be copied, and
                    // the caller can deal with those after returning.
                    nestedStringTreeCopyInfos.Push(StringCopyInfo(s, &buffer[remainingCharLengthToCopy]));
                }
                else
                {
                    Assert(recursionDepth <= MaxCopyRecursionDepth);
                    s->Copy(&buffer[remainingCharLengthToCopy], nestedStringTreeCopyInfos, recursionDepth + 1);
                }
            }
        }

        Assert(remainingCharLengthToCopy == directCharLength);
        if(remainingCharLengthToCopy != 0)
        {
            // Determine the number of direct chars in the current block
            CharCount blockCharLength;
            if(pointerIndex == 0)
            {
                // The string switched to pointer mode at the beginning of the current block, or the string never switched to
                // pointer mode and the last block is empty. In either case, direct chars span to the end of the previous block.
                Assert(block);
                block = block->Previous();
                Assert(block);
                blockCharLength = block->CharLength();
            }
            else if(hasOnlyDirectChars)
            {
                // The string never switched to pointer mode, so the current block's char length is where direct chars end
                blockCharLength = block == lastBlock ? LastBlockCharLength() : block->CharLength();
            }
            else
            {
                // The string switched to pointer mode somewhere in the middle of the current block. To determine where direct
                // chars end in this block, all previous blocks are scanned and their char lengths discounted.
                blockCharLength = remainingCharLengthToCopy;
                if(block)
                {
                    for(const Block *previousBlock = block->Previous();
                        previousBlock;
                        previousBlock = previousBlock->Previous())
                    {
                        Assert(blockCharLength >= previousBlock->CharLength());
                        blockCharLength -= previousBlock->CharLength();
                    }
                }
                Assert(Block::PointerLengthFromCharLength(blockCharLength) == pointerIndex);
            }

            // Copy direct chars
            const char16 *blockChars = block == lastBlock ? LastBlockChars() : block->Chars();
            while(true)
            {
                if(blockCharLength != 0)
                {
                    Assert(remainingCharLengthToCopy >= blockCharLength);
                    remainingCharLengthToCopy -= blockCharLength;
                    // SWB: this is copying "direct chars" and there should be no pointers here. No write barrier needed.
                    js_wmemcpy_s(&buffer[remainingCharLengthToCopy], blockCharLength, blockChars, blockCharLength);
                    if(remainingCharLengthToCopy == 0)
                        break;
                }

                Assert(block);
                block = block->Previous();
                Assert(block);
                blockChars = block->Chars();
                blockCharLength = block->CharLength();
            }
        }

    #if DBG
        // Verify that all nonempty blocks have been visited
        if(block)
        {
            while(true)
            {
                block = block->Previous();
                if(!block)
                    break;
                Assert(block->CharLength() == 0);
            }
        }
    #endif

        Assert(remainingCharLengthToCopy == 0);
    }